

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t header_pax_extension
                  (archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  char cVar1;
  char *pcVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  ulong uVar5;
  int64_t iVar6;
  char *pcVar7;
  archive_string_conv *sc;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  tar *ptVar11;
  ulong uVar12;
  int error_number;
  char *_p;
  size_t request;
  ulong uVar13;
  size_t sVar14;
  long lVar15;
  ssize_t did_read;
  ulong local_70;
  archive_read *local_68;
  tar *local_60;
  archive_string local_58;
  archive_entry *local_38;
  
  uVar5 = tar_atol((char *)((long)h + 0x7c),0xc);
  if (0xfffffffffffffff < (long)uVar5) {
    return L'\xffffffe2';
  }
  if ((long)uVar5 < 0) {
    archive_set_error(&a->archive,0x16,"pax extension header has invalid size: %lld",uVar5);
    return L'\xffffffe2';
  }
  uVar13 = (ulong)(-(int)uVar5 & 0x1ff);
  if (0x40000000 < uVar5) {
    iVar6 = __archive_read_consume(a,uVar13 + uVar5);
    if (uVar13 + uVar5 == iVar6) {
      archive_set_error(&a->archive,0x16,"Ignoring oversized pax extensions: %d > %d",
                        uVar5 & 0xffffffff,0x40000000);
      return L'\xffffffec';
    }
    return L'\xffffffe2';
  }
  if (*unconsumed != 0) {
    __archive_read_consume(a,*unconsumed);
    *unconsumed = 0;
  }
  local_58.s = (char *)0x0;
  local_58.length = 0;
  local_58.buffer_length = 0;
  if (uVar5 == 0) {
    uVar5 = 0;
    wVar4 = L'\0';
  }
  else {
    wVar4 = L'\0';
    local_60 = tar;
    local_38 = entry;
    do {
      sVar14 = 0x200;
      if (uVar5 < 0x200) {
        sVar14 = uVar5;
      }
      pcVar7 = (char *)__archive_read_ahead(a,sVar14,(ssize_t *)&local_70);
      if (pcVar7 == (char *)0x0) {
        pcVar7 = "Truncated tar archive detected while reading pax attribute name";
LAB_0014a4a4:
        archive_set_error(&a->archive,0x16,pcVar7);
        return L'\xffffffe2';
      }
      uVar12 = uVar5;
      if (((long)local_70 <= (long)uVar5) && (uVar12 = local_70, (long)local_70 < 1)) {
LAB_0014a2d5:
        pcVar7 = "Ignoring malformed pax attributes: overlarge attribute size field";
LAB_0014a2e8:
        error_number = -1;
        uVar12 = uVar5;
LAB_0014a2ed:
        archive_set_error(&a->archive,error_number,pcVar7);
        uVar5 = uVar12;
LAB_0014a311:
        *unconsumed = *unconsumed + uVar5 + uVar13;
        return L'\xffffffec';
      }
      local_70 = uVar12;
      pcVar8 = pcVar7 + local_70;
      pcVar9 = pcVar7 + 2;
      lVar15 = -3;
      lVar10 = -2;
      uVar12 = 0;
      pcVar2 = pcVar7;
      while( true ) {
        _p = pcVar2 + 1;
        cVar1 = *pcVar2;
        if (cVar1 == ' ') break;
        if ((byte)(cVar1 - 0x3aU) < 0xf6) {
          pcVar7 = "Ignoring malformed pax attributes: malformed attribute size field";
          goto LAB_0014a2e8;
        }
        uVar12 = (ulong)(byte)(cVar1 - 0x30) + uVar12 * 10;
        if (99999999 < uVar12) {
          archive_set_error(&a->archive,-1,"Ignoring malformed pax attribute: size > %lld",99999999)
          ;
          goto LAB_0014a311;
        }
        lVar15 = lVar15 + -1;
        lVar10 = lVar10 + -1;
        pcVar9 = pcVar9 + 1;
        pcVar2 = _p;
        if (pcVar8 <= _p) goto LAB_0014a2d5;
      }
      if ((long)uVar5 < (long)uVar12) {
        archive_set_error(&a->archive,-1,"Ignoring malformed pax attribute:  %lld > %lld",uVar12,
                          uVar5);
        *unconsumed = *unconsumed + uVar13 + uVar5;
        return L'\xffffffec';
      }
      if (((pcVar8 <= _p) || (pcVar7 + uVar12 <= _p)) || (*_p == '=')) {
        pcVar7 = "Ignoring malformed pax attributes: empty name found";
        goto LAB_0014a2e8;
      }
      sVar14 = 0;
      do {
        local_68 = a;
        if ((pcVar8 <= pcVar9) || (pcVar7 + uVar12 <= pcVar9)) {
          pcVar7 = "Ignoring malformed pax attributes: overlarge attribute name";
          goto LAB_0014a2e8;
        }
        sVar14 = sVar14 + 1;
        lVar10 = lVar10 + -1;
        cVar1 = *pcVar9;
        pcVar9 = pcVar9 + 1;
      } while (cVar1 != '=');
      local_58.length = 0;
      archive_strncat(&local_58,_p,sVar14);
      request = *unconsumed - lVar10;
      *unconsumed = request;
      if (request != 0) {
        __archive_read_consume(local_68,request);
        *unconsumed = 0;
      }
      entry = local_38;
      a = local_68;
      wVar3 = pax_attribute(local_68,local_60,local_38,local_58.s,local_58.length,
                            (lVar15 + uVar12) - sVar14,unconsumed);
      uVar5 = uVar5 - uVar12;
      uVar12 = uVar5 + 1;
      archive_string_free(&local_58);
      sVar14 = *unconsumed;
      if (wVar3 < L'\xffffffec') {
        *unconsumed = uVar12 + uVar13 + sVar14;
        return wVar3;
      }
      if (wVar3 <= wVar4) {
        wVar4 = wVar3;
      }
      if (sVar14 != 0) {
        __archive_read_consume(a,sVar14);
        *unconsumed = 0;
      }
      pcVar7 = (char *)__archive_read_ahead(a,1,(ssize_t *)&local_70);
      tar = local_60;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = "Truncated tar archive detected while completing pax attribute";
        goto LAB_0014a4a4;
      }
      if (*pcVar7 != '\n') {
        pcVar7 = "Malformed pax attributes";
        error_number = 0x16;
        goto LAB_0014a2ed;
      }
      sVar14 = *unconsumed + 1;
      *unconsumed = sVar14;
      if (sVar14 != 0) {
        __archive_read_consume(a,sVar14);
        *unconsumed = 0;
      }
    } while (1 < (long)uVar12);
  }
  *unconsumed = uVar5 + uVar13;
  if (tar->pax_hdrcharset_utf8 == 0) {
    sc = tar->opt_sconv;
  }
  else {
    sc = archive_string_conversion_from_charset((archive_conflict *)a,"UTF-8",L'\x01');
    if (sc == (archive_string_conv *)0x0) {
      return L'\xffffffe2';
    }
    if (tar->compat_2x != 0) {
      archive_string_conversion_set_opt(sc,L'\x01');
    }
  }
  sVar14 = (tar->entry_pathname_override).length;
  if (sVar14 == 0) {
    sVar14 = (tar->entry_pathname).length;
    ptVar11 = tar;
    if (sVar14 == 0) goto LAB_0014a392;
  }
  else {
    ptVar11 = (tar *)&tar->entry_pathname_override;
  }
  wVar3 = _archive_entry_copy_pathname_l(entry,(ptVar11->entry_pathname).s,sVar14,sc);
  if (wVar3 != L'\0') {
    wVar4 = set_conversion_failed_error(a,sc,"Pathname");
    if (wVar4 == L'\xffffffe2') {
      return L'\xffffffe2';
    }
    archive_entry_copy_pathname(entry,(ptVar11->entry_pathname).s);
  }
LAB_0014a392:
  sVar14 = (tar->entry_uname).length;
  if ((sVar14 != 0) &&
     (wVar3 = _archive_entry_copy_uname_l(entry,(tar->entry_uname).s,sVar14,sc), wVar3 != L'\0')) {
    wVar4 = set_conversion_failed_error(a,sc,"Uname");
    if (wVar4 == L'\xffffffe2') {
      return L'\xffffffe2';
    }
    archive_entry_copy_uname(entry,(tar->entry_uname).s);
  }
  sVar14 = (tar->entry_gname).length;
  if ((sVar14 != 0) &&
     (wVar3 = _archive_entry_copy_gname_l(entry,(tar->entry_gname).s,sVar14,sc), wVar3 != L'\0')) {
    wVar4 = set_conversion_failed_error(a,sc,"Gname");
    if (wVar4 == L'\xffffffe2') {
      return L'\xffffffe2';
    }
    archive_entry_copy_gname(entry,(tar->entry_gname).s);
  }
  sVar14 = (tar->entry_linkpath).length;
  if ((sVar14 != 0) &&
     (wVar3 = _archive_entry_copy_link_l(entry,(tar->entry_linkpath).s,sVar14,sc), wVar3 != L'\0'))
  {
    wVar4 = set_conversion_failed_error(a,sc,"Linkpath");
    if (wVar4 == L'\xffffffe2') {
      return L'\xffffffe2';
    }
    archive_entry_copy_link(entry,(tar->entry_linkpath).s);
  }
  tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
  return wVar4;
}

Assistant:

static int
header_pax_extension(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	/* Sanity checks: The largest `x` body I've ever heard of was
	 * a little over 4MB.  So I doubt there has ever been a
	 * well-formed archive with an `x` body over 1GiB.  Similarly,
	 * it seems plausible that no single attribute has ever been
	 * larger than 100MB.  So if we see a larger value here, it's
	 * almost certainly a sign of a corrupted/malicious archive. */

	/* Maximum sane size for extension body: 1 GiB */
	/* This cannot be raised to larger than 8GiB without
	 * exceeding the maximum size for a standard ustar
	 * entry. */
	const int64_t ext_size_limit = 1024 * 1024 * (int64_t)1024;
	/* Maximum size for a single line/attr: 100 million characters */
	/* This cannot be raised to more than 2GiB without exceeding
	 * a `size_t` on 32-bit platforms. */
	const size_t max_parsed_line_length = 99999999ULL;
	/* Largest attribute prolog:  size + name. */
	const size_t max_size_name = 512;

	/* Size and padding of the full extension body */
	int64_t ext_size, ext_padding;
	size_t line_length, value_length, name_length;
	ssize_t to_read, did_read;
	const struct archive_entry_header_ustar *header;
	const char *p, *attr_start, *name_start;
	struct archive_string_conv *sconv;
	struct archive_string *pas = NULL;
	struct archive_string attr_name;
	int err = ARCHIVE_OK, r;

	header = (const struct archive_entry_header_ustar *)h;
	ext_size  = tar_atol(header->size, sizeof(header->size));
	if (ext_size > entry_limit) {
		return (ARCHIVE_FATAL);
	}
	if (ext_size < 0) {
	  archive_set_error(&a->archive, EINVAL,
			    "pax extension header has invalid size: %lld",
			    (long long)ext_size);
	  return (ARCHIVE_FATAL);
	}

	ext_padding = 0x1ff & (-ext_size);
	if (ext_size > ext_size_limit) {
		/* Consume the pax extension body and return an error */
		if (ext_size + ext_padding != __archive_read_consume(a, ext_size + ext_padding)) {
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive, EINVAL,
		    "Ignoring oversized pax extensions: %d > %d",
		    (int)ext_size, (int)ext_size_limit);
		return (ARCHIVE_WARN);
	}
	tar_flush_unconsumed(a, unconsumed);

	/* Parse the size/name of each pax attribute in the body */
	archive_string_init(&attr_name);
	while (ext_size > 0) {
		/* Read enough bytes to parse the size/name of the next attribute */
		to_read = max_size_name;
		if (to_read > ext_size) {
			to_read = ext_size;
		}
		p = __archive_read_ahead(a, to_read, &did_read);
		if (p == NULL) { /* EOF */
			archive_set_error(&a->archive, EINVAL,
					  "Truncated tar archive"
					  " detected while reading pax attribute name");
			return (ARCHIVE_FATAL);
		}
		if (did_read > ext_size) {
			did_read = ext_size;
		}

		/* Parse size of attribute */
		line_length = 0;
		attr_start = p;
		while (1) {
			if (p >= attr_start + did_read) {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
						  "Ignoring malformed pax attributes: overlarge attribute size field");
				*unconsumed += ext_size + ext_padding;
				return (ARCHIVE_WARN);
			}
			if (*p == ' ') {
				p++;
				break;
			}
			if (*p < '0' || *p > '9') {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
						  "Ignoring malformed pax attributes: malformed attribute size field");
				*unconsumed += ext_size + ext_padding;
				return (ARCHIVE_WARN);
			}
			line_length *= 10;
			line_length += *p - '0';
			if (line_length > max_parsed_line_length) {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
						  "Ignoring malformed pax attribute: size > %lld",
						  (long long)max_parsed_line_length);
				*unconsumed += ext_size + ext_padding;
				return (ARCHIVE_WARN);
			}
			p++;
		}

		if ((int64_t)line_length > ext_size) {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
						  "Ignoring malformed pax attribute:  %lld > %lld",
						  (long long)line_length, (long long)ext_size);
				*unconsumed += ext_size + ext_padding;
				return (ARCHIVE_WARN);
		}

		/* Parse name of attribute */
		if (p >= attr_start + did_read
		    || p >= attr_start + line_length
		    || *p == '=') {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
					  "Ignoring malformed pax attributes: empty name found");
			*unconsumed += ext_size + ext_padding;
			return (ARCHIVE_WARN);
		}
		name_start = p;
		while (1) {
			if (p >= attr_start + did_read || p >= attr_start + line_length) {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
						  "Ignoring malformed pax attributes: overlarge attribute name");
				*unconsumed += ext_size + ext_padding;
				return (ARCHIVE_WARN);
			}
			if (*p == '=') {
				break;
			}
			p++;
		}
		name_length = p - name_start;
		p++; // Skip '='

		// Save the name before we consume it
		archive_strncpy(&attr_name, name_start, name_length);

		ext_size -= p - attr_start;
		value_length = line_length - (p - attr_start);

		/* Consume size, name, and `=` */
		*unconsumed += p - attr_start;
		tar_flush_unconsumed(a, unconsumed);

		/* pax_attribute will consume value_length - 1 */
		r = pax_attribute(a, tar, entry, attr_name.s, archive_strlen(&attr_name), value_length - 1, unconsumed);
		ext_size -= value_length - 1;

		// Release the allocated attr_name (either here or before every return in this function)
		archive_string_free(&attr_name);

		if (r < ARCHIVE_WARN) {
			*unconsumed += ext_size + ext_padding;
			return (r);
		}
		err = err_combine(err, r);

		/* Consume the `\n` that follows the pax attribute value. */
		tar_flush_unconsumed(a, unconsumed);
		p = __archive_read_ahead(a, 1, &did_read);
		if (p == NULL) {
			archive_set_error(&a->archive, EINVAL,
					  "Truncated tar archive"
					  " detected while completing pax attribute");
			return (ARCHIVE_FATAL);
		}
		if (p[0] != '\n') {
			archive_set_error(&a->archive, EINVAL,
					  "Malformed pax attributes");
			*unconsumed += ext_size + ext_padding;
			return (ARCHIVE_WARN);
		}
		ext_size -= 1;
		*unconsumed += 1;
		tar_flush_unconsumed(a, unconsumed);
	}
	*unconsumed += ext_size + ext_padding;

	/*
	 * Some PAX values -- pathname, linkpath, uname, gname --
	 * can't be copied into the entry until we know the character
	 * set to use:
	 */
	if (!tar->pax_hdrcharset_utf8)
		/* PAX specified "BINARY", so use the default charset */
		sconv = tar->opt_sconv;
	else {
		/* PAX default UTF-8 */
		sconv = archive_string_conversion_from_charset(
		    &(a->archive), "UTF-8", 1);
		if (sconv == NULL)
			return (ARCHIVE_FATAL);
		if (tar->compat_2x)
			archive_string_conversion_set_opt(sconv,
			    SCONV_SET_OPT_UTF8_LIBARCHIVE2X);
	}

	/* Pathname */
	pas = NULL;
	if (archive_strlen(&(tar->entry_pathname_override)) > 0) {
		/* Prefer GNU.sparse.name attribute if present */
		/* GNU sparse files store a fake name under the standard
		 * "pathname" key. */
		pas = &(tar->entry_pathname_override);
	} else if (archive_strlen(&(tar->entry_pathname)) > 0) {
		/* Use standard "pathname" PAX extension */
		pas = &(tar->entry_pathname);
	}
	if (pas != NULL) {
		if (archive_entry_copy_pathname_l(entry, pas->s,
		    archive_strlen(pas), sconv) != 0) {
			err = set_conversion_failed_error(a, sconv, "Pathname");
			if (err == ARCHIVE_FATAL)
				return (err);
			/* Use raw name without conversion */
			archive_entry_copy_pathname(entry, pas->s);
		}
	}
	/* Uname */
	if (archive_strlen(&(tar->entry_uname)) > 0) {
		if (archive_entry_copy_uname_l(entry, tar->entry_uname.s,
		    archive_strlen(&(tar->entry_uname)), sconv) != 0) {
			err = set_conversion_failed_error(a, sconv, "Uname");
			if (err == ARCHIVE_FATAL)
				return (err);
			/* Use raw name without conversion */
			archive_entry_copy_uname(entry, tar->entry_uname.s);
		}
	}
	/* Gname */
	if (archive_strlen(&(tar->entry_gname)) > 0) {
		if (archive_entry_copy_gname_l(entry, tar->entry_gname.s,
		    archive_strlen(&(tar->entry_gname)), sconv) != 0) {
			err = set_conversion_failed_error(a, sconv, "Gname");
			if (err == ARCHIVE_FATAL)
				return (err);
			/* Use raw name without conversion */
			archive_entry_copy_gname(entry, tar->entry_gname.s);
		}
	}
	/* Linkpath */
	if (archive_strlen(&(tar->entry_linkpath)) > 0) {
		if (archive_entry_copy_link_l(entry, tar->entry_linkpath.s,
		    archive_strlen(&(tar->entry_linkpath)), sconv) != 0) {
			err = set_conversion_failed_error(a, sconv, "Linkpath");
			if (err == ARCHIVE_FATAL)
				return (err);
			/* Use raw name without conversion */
			archive_entry_copy_link(entry, tar->entry_linkpath.s);
		}
	}

	/* Extension may have given us a corrected `entry_bytes_remaining` for
	 * the main entry; update the padding appropriately. */
	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);
	return (err);
}